

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

QMetaType __thiscall QMetaType::underlyingType(QMetaType *this)

{
  bool bVar1;
  qsizetype qVar2;
  QMetaType *in_RDI;
  long in_FS_OFFSET;
  TypeFlag in_stack_ffffffffffffffac;
  QMetaType *in_stack_ffffffffffffffb0;
  byte local_29;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_1c;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_18;
  QFlagsStorageHelper<QMetaType::TypeFlag,_4> local_14;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = 1;
  if (in_RDI->d_ptr != (QMetaTypeInterface *)0x0) {
    local_18.super_QFlagsStorage<QMetaType::TypeFlag>.i =
         (QFlagsStorage<QMetaType::TypeFlag>)flags(in_stack_ffffffffffffffb0);
    local_14.super_QFlagsStorage<QMetaType::TypeFlag>.i =
         (QFlagsStorage<QMetaType::TypeFlag>)
         QFlags<QMetaType::TypeFlag>::operator&
                   ((QFlags<QMetaType::TypeFlag> *)in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffac);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    local_29 = bVar1 ^ 0xff;
  }
  if ((local_29 & 1) != 0) {
    memset(&local_10,0,8);
    QMetaType(&local_10);
    goto LAB_0038c178;
  }
  flags(in_stack_ffffffffffffffb0);
  local_1c.super_QFlagsStorage<QMetaType::TypeFlag>.i =
       (QFlagsStorage<QMetaType::TypeFlag>)
       QFlags<QMetaType::TypeFlag>::operator&
                 ((QFlags<QMetaType::TypeFlag> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac
                 );
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
  if (bVar1) {
    qVar2 = sizeOf(in_RDI);
    switch(qVar2) {
    case 1:
      local_10 = fromType<unsigned_char>();
      break;
    case 2:
      local_10 = fromType<unsigned_short>();
      break;
    default:
      goto LAB_0038c15d;
    case 4:
      local_10 = fromType<unsigned_int>();
      break;
    case 8:
      local_10 = fromType<unsigned_long_long>();
    }
  }
  else {
    qVar2 = sizeOf(in_RDI);
    switch(qVar2) {
    case 1:
      local_10 = fromType<signed_char>();
      break;
    case 2:
      local_10 = fromType<short>();
      break;
    default:
LAB_0038c15d:
      memset(&local_10,0,8);
      QMetaType(&local_10);
      break;
    case 4:
      local_10 = fromType<int>();
      break;
    case 8:
      local_10 = fromType<long_long>();
    }
  }
LAB_0038c178:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QMetaType)local_10.d_ptr;
  }
  __stack_chk_fail();
}

Assistant:

QMetaType QMetaType::underlyingType() const
{
    if (!d_ptr || !(flags() & IsEnumeration))
        return {};
    /* QFlags has enumeration set so that's handled here (qint32
       case), as QFlags uses int as the underlying type
       Note that we do some approximation here, as we cannot
       differentiate between different underlying types of the
       same size and signedness (consider char <-> (un)signed char,
       int <-> long <-> long long).
    */
    if (flags() & IsUnsignedEnumeration) {
        switch (sizeOf()) {
        case 1:
            return QMetaType::fromType<quint8>();
        case 2:
            return QMetaType::fromType<quint16>();
        case 4:
            return QMetaType::fromType<quint32>();
        case 8:
            return QMetaType::fromType<quint64>();
        default:
            break;
        }
    } else {
        switch (sizeOf()) {
        case 1:
            return QMetaType::fromType<qint8>();
        case 2:
            return QMetaType::fromType<qint16>();
        case 4:
            return QMetaType::fromType<qint32>();
        case 8:
            return QMetaType::fromType<qint64>();
        default:
            break;
        }
    }
    // int128 can be handled above once we have qint128
    return QMetaType();
}